

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_add_tet_without_faceid(REF_CAVITY ref_cavity,REF_INT tet,REF_INT faceid)

{
  REF_GRID pRVar1;
  REF_CELL pRVar2;
  REF_CELL ref_cell;
  REF_NODE pRVar3;
  uint uVar4;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT already_have_it;
  REF_INT face_nodes [3];
  REF_INT tri_index;
  REF_INT node;
  REF_INT cell_face;
  REF_NODE ref_node;
  REF_CELL tri_cell;
  REF_CELL tet_cell;
  REF_GRID ref_grid;
  REF_INT faceid_local;
  REF_INT tet_local;
  REF_CAVITY ref_cavity_local;
  
  pRVar1 = ref_cavity->ref_grid;
  pRVar2 = pRVar1->cell[8];
  ref_cell = pRVar1->cell[3];
  pRVar3 = pRVar1->node;
  if (((tet < 0) || (pRVar2->max <= tet)) || (pRVar2->c2n[pRVar2->size_per * tet] == -1)) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x252,
           "ref_cavity_add_tet_without_faceid","invalid tet");
    ref_cavity_local._4_4_ = 1;
  }
  else {
    ref_cavity_local._4_4_ =
         ref_list_contains(ref_cavity->tet_list,tet,&ref_private_macro_code_rss_1);
    if (ref_cavity_local._4_4_ == 0) {
      if (ref_private_macro_code_rss_1 == 0) {
        ref_cavity_local._4_4_ = ref_list_push(ref_cavity->tet_list,tet);
        if (ref_cavity_local._4_4_ == 0) {
          for (tri_index = 0; tri_index < pRVar2->face_per; tri_index = tri_index + 1) {
            for (face_nodes[2] = 0; face_nodes[2] < 3; face_nodes[2] = face_nodes[2] + 1) {
              (&ref_private_macro_code_rss)[face_nodes[2]] =
                   pRVar2->c2n[pRVar2->f2n[face_nodes[2] + tri_index * 4] + pRVar2->size_per * tet];
              if (pRVar3->ref_mpi->id != pRVar3->part[(&ref_private_macro_code_rss)[face_nodes[2]]])
              {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
            }
            uVar4 = ref_cell_with(ref_cell,&ref_private_macro_code_rss,face_nodes + 1);
            if ((uVar4 != 0) && (uVar4 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x264,"ref_cavity_add_tet_without_faceid",(ulong)uVar4,
                     "search for boundary tri");
              return uVar4;
            }
            if ((face_nodes[1] == -1) ||
               (ref_cell->c2n[ref_cell->size_per * face_nodes[1] + 3] != faceid)) {
              uVar4 = ref_cavity_insert_face(ref_cavity,&ref_private_macro_code_rss);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x26a,"ref_cavity_add_tet_without_faceid",(ulong)uVar4,"tet side");
                return uVar4;
              }
              if (ref_cavity->state != REF_CAVITY_UNKNOWN) {
                return 0;
              }
            }
          }
          ref_cavity_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 600,"ref_cavity_add_tet_without_faceid",(ulong)ref_cavity_local._4_4_,"save tet");
        }
      }
      else {
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x255,"ref_cavity_add_tet_without_faceid",(ulong)ref_cavity_local._4_4_,"have tet?");
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

static REF_FCN REF_STATUS ref_cavity_add_tet_without_faceid(
    REF_CAVITY ref_cavity, REF_INT tet, REF_INT faceid) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_CELL tet_cell = ref_grid_tet(ref_grid);
  REF_CELL tri_cell = ref_grid_tri(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT cell_face, node, tri_index;
  REF_INT face_nodes[3];
  REF_INT already_have_it;

  RAS(ref_cell_valid(tet_cell, tet), "invalid tet");

  RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), tet, &already_have_it),
      "have tet?");
  if (already_have_it) return REF_SUCCESS;

  RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), tet), "save tet");

  each_ref_cell_cell_face(tet_cell, cell_face) {
    each_ref_cavity_face_node(ref_cavity, node) {
      face_nodes[node] = ref_cell_f2n(tet_cell, node, cell_face, tet);
      if (!ref_node_owned(ref_node, face_nodes[node])) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }

    RXS(ref_cell_with(tri_cell, face_nodes, &tri_index), REF_NOT_FOUND,
        "search for boundary tri");
    if (REF_EMPTY != tri_index &&
        ref_cell_c2n(tri_cell, 3, tri_index) == faceid) {
      continue;
    }

    RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
    if (REF_CAVITY_UNKNOWN != ref_cavity_state(ref_cavity)) return REF_SUCCESS;
  }

  return REF_SUCCESS;
}